

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames;
  bool bVar1;
  FILE *__stream;
  Scripting *scripting;
  pointer *__ptr;
  uint uVar2;
  ulong uVar3;
  Trace *trace_00;
  unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> report_writer;
  Profile profile_1;
  RomAccessor rom_accessor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  copy;
  AnnotationResolver annotations;
  Trace trace;
  Options options;
  ReportWriter *local_348;
  Profile local_340;
  RomAccessor local_328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310;
  undefined1 local_2f8 [16];
  pointer local_2e8;
  _Base_ptr p_Stack_2e0;
  _Base_ptr local_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  int iStack_2c0;
  pointer local_2b8;
  int local_2b0;
  pointer local_2a0;
  pointer local_288;
  undefined1 local_260 [48];
  pointer local_230;
  pointer local_208;
  pointer local_1f0;
  Options local_1c8;
  
  snestistics::initLookupTables();
  local_1c8.rom_file._M_dataplus._M_p = (pointer)&local_1c8.rom_file.field_2;
  local_1c8.rom_file._M_string_length = 0;
  local_1c8.rom_file.field_2._M_local_buf[0] = '\0';
  local_1c8.rom_size = 0;
  local_1c8.trace_log_out_file._M_dataplus._M_p = (pointer)&local_1c8.trace_log_out_file.field_2;
  local_1c8.trace_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.trace_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.trace_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.nmi_first = 0;
  local_1c8.nmi_last = 0;
  local_1c8.trace_log_out_file._M_string_length = 0;
  local_1c8.trace_log_out_file.field_2._M_local_buf[0] = '\0';
  local_1c8.script_file._M_dataplus._M_p = (pointer)&local_1c8.script_file.field_2;
  local_1c8.script_file._M_string_length = 0;
  local_1c8.script_file.field_2._M_local_buf[0] = '\0';
  local_1c8.labels_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.labels_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.labels_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.auto_labels_file._M_dataplus._M_p = (pointer)&local_1c8.auto_labels_file.field_2;
  local_1c8.auto_labels_file._M_string_length = 0;
  local_1c8.auto_labels_file.field_2._M_local_buf[0] = '\0';
  local_1c8.auto_annotate = false;
  local_1c8.symbol_fma_out_file._M_dataplus._M_p = (pointer)&local_1c8.symbol_fma_out_file.field_2;
  local_1c8.symbol_fma_out_file._M_string_length = 0;
  local_1c8.symbol_fma_out_file.field_2._M_local_buf[0] = '\0';
  local_1c8.symbol_mesen_s_out_file._M_dataplus._M_p =
       (pointer)&local_1c8.symbol_mesen_s_out_file.field_2;
  local_1c8.symbol_mesen_s_out_file._M_string_length = 0;
  local_1c8.symbol_mesen_s_out_file.field_2._M_local_buf[0] = '\0';
  local_1c8.rewind_out_file._M_dataplus._M_p = (pointer)&local_1c8.rewind_out_file.field_2;
  local_1c8.rewind_out_file._M_string_length = 0;
  local_1c8.rewind_out_file.field_2._M_local_buf[0] = '\0';
  local_1c8.report_out_file._M_dataplus._M_p = (pointer)&local_1c8.report_out_file.field_2;
  local_1c8.report_out_file._M_string_length = 0;
  local_1c8.report_out_file.field_2._M_local_buf[0] = '\0';
  local_1c8.asm_out_file._M_dataplus._M_p = (pointer)&local_1c8.asm_out_file.field_2;
  local_1c8.asm_out_file._M_string_length = 0;
  local_1c8.asm_out_file.field_2._M_local_buf[0] = '\0';
  local_1c8.asm_header_file._M_dataplus._M_p = (pointer)&local_1c8.asm_header_file.field_2;
  local_1c8.asm_header_file._M_string_length = 0;
  local_1c8.asm_header_file.field_2._M_local_buf[0] = '\0';
  local_1c8.asm_print_dp = true;
  local_1c8.asm_lower_case_op = true;
  local_1c8.asm_print_pc = true;
  local_1c8.asm_print_bytes = true;
  local_1c8.asm_print_register_sizes = true;
  local_1c8.asm_print_db = true;
  local_1c8.asm_correct_wla = false;
  local_1c8.predict = PRD_FUNCTIONS;
  parse_options(argc,argv,&local_1c8);
  printf("Loading ROM \'%s\'\n",local_1c8.rom_file._M_dataplus._M_p);
  local_328._rom_offset = 0xffffffff;
  local_328._calculated_size = local_1c8.rom_size;
  local_328._rom_data._data = (uchar *)0x0;
  local_328._rom_data._size = 0;
  local_260._0_8_ = "Load ROM data";
  local_260._8_8_ = clock();
  local_260[0x10] = false;
  printf("%s...\n","Load ROM data");
  snestistics::RomAccessor::load(&local_328,&local_1c8.rom_file);
  snestistics::Profile::~Profile((Profile *)local_260);
  snestistics::Trace::Trace((Trace *)local_260);
  if (local_1c8.trace_files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1c8.trace_files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      snestistics::Trace::Trace((Trace *)local_2f8);
      trace_00 = (Trace *)local_2f8;
      if (uVar2 == 1) {
        trace_00 = (Trace *)local_260;
      }
      bVar1 = snestistics::load_trace_cache
                        (local_1c8.trace_files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar3,trace_00);
      if (!bVar1) {
        local_340._msg = "Create trace using emulation";
        local_340._start = clock();
        local_340._hide_if_fast = false;
        printf("%s...\n","Create trace using emulation");
        snestistics::create_trace
                  (local_1c8.trace_files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar3,&local_328,trace_00);
        snestistics::Profile::~Profile(&local_340);
      }
      if (uVar2 != 1) {
        snestistics::merge_trace((Trace *)local_260,trace_00);
      }
      if (local_288 != (pointer)0x0) {
        operator_delete(local_288);
      }
      if (local_2a0 != (pointer)0x0) {
        operator_delete(local_2a0);
      }
      if ((void *)CONCAT44(uStack_2c4,local_2c8) != (void *)0x0) {
        operator_delete((void *)CONCAT44(uStack_2c4,local_2c8));
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>,_std::_Select1st<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>,_std::_Select1st<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
                   *)local_2f8);
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < (ulong)((long)local_1c8.trace_files.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1c8.trace_files.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  filenames = &local_1c8.labels_files;
  if ((local_1c8.auto_labels_file._M_string_length != 0) &&
     ((__stream = fopen(local_1c8.auto_labels_file._M_dataplus._M_p,"rb"), __stream == (FILE *)0x0
      || (fclose(__stream), local_1c8.auto_annotate != false)))) {
    local_340._msg = "Regenerating auto-labels";
    local_340._start = clock();
    local_340._hide_if_fast = false;
    printf("%s...\n","Regenerating auto-labels");
    local_2b8 = (pointer)0x0;
    local_2b0 = 0;
    local_2f8._0_8_ = (pointer)0x0;
    local_2f8._8_8_ = (pointer)0x0;
    local_2e8 = (pointer)0x0;
    p_Stack_2e0 = (_Base_ptr)0x0;
    local_2d8 = (_Base_ptr)0x0;
    uStack_2d0 = 0;
    uStack_2cc = 0;
    local_2c8 = 0;
    uStack_2c4 = 0;
    iStack_2c0 = 0;
    snestistics::AnnotationResolver::load((AnnotationResolver *)local_2f8,filenames);
    snestistics::guess_range
              ((Trace *)local_260,&local_328,(AnnotationResolver *)local_2f8,
               &local_1c8.auto_labels_file);
    snestistics::AnnotationResolver::~AnnotationResolver((AnnotationResolver *)local_2f8);
    snestistics::Profile::~Profile(&local_340);
  }
  local_2b8 = (pointer)0x0;
  local_2b0 = 0;
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_8_ = (pointer)0x0;
  local_2e8 = (pointer)0x0;
  p_Stack_2e0 = (_Base_ptr)0x0;
  local_2d8 = (_Base_ptr)0x0;
  uStack_2d0 = 0;
  uStack_2cc = 0;
  local_2c8 = 0;
  uStack_2c4 = 0;
  iStack_2c0 = 0;
  local_340._msg = "Loading game annotations";
  local_340._start = clock();
  local_340._hide_if_fast = false;
  printf("%s...\n","Loading game annotations");
  snestistics::AnnotationResolver::add_mmio_annotations((AnnotationResolver *)local_2f8);
  snestistics::AnnotationResolver::add_vector_annotations
            ((AnnotationResolver *)local_2f8,&local_328);
  if (local_1c8.auto_labels_file._M_string_length == 0) {
    snestistics::AnnotationResolver::load((AnnotationResolver *)local_2f8,filenames);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_310,filenames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_310,&local_1c8.auto_labels_file);
    snestistics::AnnotationResolver::load((AnnotationResolver *)local_2f8,&local_310);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_310);
  }
  snestistics::Profile::~Profile(&local_340);
  if (local_1c8.symbol_fma_out_file._M_string_length != 0) {
    snestistics::symbol_export_fma
              ((AnnotationResolver *)local_2f8,&local_1c8.symbol_fma_out_file,false);
  }
  if (local_1c8.symbol_mesen_s_out_file._M_string_length != 0) {
    snestistics::symbol_export_mesen_s
              ((AnnotationResolver *)local_2f8,&local_1c8.symbol_mesen_s_out_file);
  }
  if (local_1c8.rewind_out_file._M_string_length != 0) {
    snestistics::rewind_report(&local_1c8,&local_328,(AnnotationResolver *)local_2f8);
  }
  if (local_1c8.trace_log_out_file._M_string_length != 0) {
    local_340._msg = "Create trace log";
    local_340._start = clock();
    local_340._hide_if_fast = false;
    scripting = (Scripting *)0x0;
    printf("%s...\n","Create trace log");
    if (local_1c8.script_file._M_string_length != 0) {
      scripting = scripting_interface::create_scripting(local_1c8.script_file._M_dataplus._M_p);
    }
    snestistics::write_trace_log(&local_1c8,&local_328,(AnnotationResolver *)local_2f8,scripting);
    if (scripting != (Scripting *)0x0) {
      scripting_interface::destroy_scripting(scripting);
    }
    snestistics::Profile::~Profile(&local_340);
  }
  local_348 = (ReportWriter *)0x0;
  if (local_1c8.report_out_file._M_string_length != 0) {
    local_348 = (ReportWriter *)operator_new(0x10);
    ReportWriter::ReportWriter(local_348,local_1c8.report_out_file._M_dataplus._M_p);
  }
  snestistics::predict
            (local_1c8.predict,local_348,&local_328,(Trace *)local_260,
             (AnnotationResolver *)local_2f8);
  if (local_1c8.asm_out_file._M_string_length != 0) {
    local_340._msg = "Writing asm";
    local_340._start = clock();
    local_340._hide_if_fast = false;
    printf("%s...\n","Writing asm");
    ReportWriter::ReportWriter((ReportWriter *)&local_310,local_1c8.asm_out_file._M_dataplus._M_p);
    snestistics::asm_writer
              ((ReportWriter *)&local_310,&local_1c8,(Trace *)local_260,
               (AnnotationResolver *)local_2f8,&local_328);
    ReportWriter::~ReportWriter((ReportWriter *)&local_310);
    snestistics::Profile::~Profile(&local_340);
  }
  if (local_348 != (ReportWriter *)0x0) {
    data_report(local_348,(Trace *)local_260,(AnnotationResolver *)local_2f8,true,true);
    dma_report(local_348,(Trace *)local_260,(AnnotationResolver *)local_2f8);
    branch_report(local_348,&local_328,(Trace *)local_260,(AnnotationResolver *)local_2f8);
    ReportWriter::writeSeperator(local_348,"Entry point report");
    ReportWriter::writeComment(local_348,"Disabled");
    ReportWriter::~ReportWriter(local_348);
    operator_delete(local_348);
  }
  snestistics::AnnotationResolver::~AnnotationResolver((AnnotationResolver *)local_2f8);
  if (local_1f0 != (pointer)0x0) {
    operator_delete(local_1f0);
  }
  if (local_208 != (pointer)0x0) {
    operator_delete(local_208);
  }
  if (local_230 != (pointer)0x0) {
    operator_delete(local_230);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>,_std::_Select1st<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>,_std::_Select1st<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
               *)local_260);
  if (local_328._rom_data._data != (uchar *)0x0) {
    operator_delete__(local_328._rom_data._data);
  }
  Options::~Options(&local_1c8);
  return 0;
}

Assistant:

int main(const int argc, const char * const argv[]) {
	try {
		initLookupTables();

		Options options;
		parse_options(argc, argv, options);

		printf("Loading ROM '%s'\n", options.rom_file.c_str());

		// TODO: TraceHeader has rom_size and rom_mode (lorom/hirom) so lets read them!
		RomAccessor rom_accessor(options.rom_size);
		{
			Profile profile("Load ROM data");
			rom_accessor.load(options.rom_file);
		}

		Trace trace;

		for (uint32_t k=0; k<options.trace_files.size(); ++k) {
			bool generate = true;

			Trace backing_trace;
			Trace &local_trace = k==0 ? trace : backing_trace;

			if (load_trace_cache(options.trace_files[k], local_trace))
				generate = false;

			if (generate) {
				Profile profile("Create trace using emulation");
				create_trace(options.trace_files[k], rom_accessor, local_trace); // Will automatically save new cache
			}

			if (k != 0) {
				merge_trace(trace, local_trace);
			}
		}

		if (!options.auto_labels_file.empty()) {
			FILE *test_file = fopen(options.auto_labels_file.c_str(), "rb");
			bool auto_file_exists = test_file != NULL;
			if (test_file != NULL) {
				fclose(test_file);
			}
			
			if (options.auto_annotate || !auto_file_exists) {
				Profile profile("Regenerating auto-labels");
				// We load annotations here since we want to avoid the annotation file
				AnnotationResolver annotations;
				annotations.load(options.labels_files);
				guess_range(trace, rom_accessor, annotations, options.auto_labels_file);
			}
		}

		AnnotationResolver annotations;
		{
			Profile profile("Loading game annotations");
			annotations.add_mmio_annotations();
			annotations.add_vector_annotations(rom_accessor);
			if (options.auto_labels_file.empty()) {
				// Don't load the auto-labels file if we are re-generating it
				annotations.load(options.labels_files);
			} else {
				std::vector<std::string> copy(options.labels_files);
				copy.push_back(options.auto_labels_file);
				annotations.load(copy);
			}
		}

		if (!options.symbol_fma_out_file.empty()) {
			symbol_export_fma(annotations, options.symbol_fma_out_file, false);
		}

		if (!options.symbol_mesen_s_out_file.empty()) {
			// false here is to disable multiline comments since bsnes-plus does not support them
			symbol_export_mesen_s(annotations, options.symbol_mesen_s_out_file);
		}

		// Make sure this happens after create_trace so skip file is fresh
		if (!options.rewind_out_file.empty()) {
			rewind_report(options, rom_accessor, annotations);
		}

		// Write trace log if requested
		if (!options.trace_log_out_file.empty()) {
			Profile profile("Create trace log");

			bool has_scripting = !options.script_file.empty();

			scripting_interface::Scripting *scripting = nullptr;
			
			if (!options.script_file.empty())
				scripting = scripting_interface::create_scripting(options.script_file.c_str());
			
			write_trace_log(options, rom_accessor, annotations, scripting);

			if (scripting)
				scripting_interface::destroy_scripting(scripting);
		}

		std::unique_ptr<ReportWriter> report_writer;
		if (!options.report_out_file.empty())
			report_writer.reset(new ReportWriter(options.report_out_file.c_str()));

		// TODO: Maybe run once before guess_range as well to find longer ranges
		predict(options.predict, report_writer.get(), rom_accessor, trace, annotations);

		if (!options.asm_out_file.empty()) {
			Profile profile("Writing asm");
			ReportWriter asm_output(options.asm_out_file.c_str());
			asm_writer(asm_output, options, trace, annotations, rom_accessor);
		}

		if (report_writer) {
			data_report(*report_writer, trace, annotations);
			dma_report(*report_writer, trace, annotations);
			branch_report(*report_writer, rom_accessor, trace, annotations);
			entry_point_report(*report_writer, trace, annotations);
		}

	} catch (const std::runtime_error &e) {
		printf("error: %s\n", e.what());
		return 1;
	} catch (const std::exception &e) {
		printf("error: %s\n", e.what());
		return 1;
	}

	return 0;
}